

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Edge e;
  Edge e_00;
  Halfedge e_01;
  bool bVar1;
  double *pdVar2;
  Vector2 *pVVar3;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_RDI;
  Vector2 VVar4;
  Vector2 vec;
  double alpha;
  double len;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range3;
  Vector2 principalDir;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> *in_stack_fffffffffffffe08;
  SurfaceMesh *in_stack_fffffffffffffe10;
  ParentMeshT *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe38 [16];
  Vector2 local_1b8;
  Vector2 local_1a8;
  Vector2 local_198;
  Vector2 local_188;
  ParentMeshT *local_178;
  size_t local_170;
  Vector2 local_168;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_158;
  double local_148;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_140;
  double local_130;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_118 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_e8;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *local_c0;
  Vector2 local_b8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_a8;
  undefined1 local_68 [24];
  undefined1 *local_50;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::MeshData
            (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::operator=
            ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe10);
  SurfaceMesh::faces(in_stack_fffffffffffffe10);
  local_50 = local_68;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe10);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe10);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffe10,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffe08);
    if (!bVar1) break;
    local_a8 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x2f5cc1);
    memset(&local_b8,0,0x10);
    Face::adjacentHalfedges((Face *)in_RDI);
    local_c0 = &local_e8;
    NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)in_RDI)
    ;
    NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end
              (local_118,local_c0);
    while( true ) {
      bVar1 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
              operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                          *)in_stack_fffffffffffffe10,
                         (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                          *)in_stack_fffffffffffffe08);
      if (!bVar1) break;
      local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                    ::operator*((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                                 *)0x2f5d5f);
      in_stack_fffffffffffffe10 = (SurfaceMesh *)&in_RDI[0xd].permuteCallbackIt;
      local_140 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::edge((Halfedge *)in_stack_fffffffffffffe10);
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           in_stack_fffffffffffffe30;
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           in_stack_fffffffffffffe28;
      pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_double> *)in_RDI,e);
      local_130 = *pdVar2;
      local_158 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::edge((Halfedge *)in_stack_fffffffffffffe10);
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = in_stack_fffffffffffffe30;
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffe28;
      pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_double> *)in_RDI,e_00);
      local_148 = *pdVar2;
      local_178 = local_128.mesh;
      local_170 = local_128.ind;
      e_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = in_stack_fffffffffffffe30;
      e_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffe28;
      pVVar3 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                         (in_RDI,e_01);
      local_168.x = pVVar3->x;
      local_168.y = pVVar3->y;
      local_1b8 = Vector2::operator-(&local_168);
      local_1a8 = Vector2::operator*(&local_1b8,&local_168);
      local_198 = Vector2::operator/(&local_1a8,local_130);
      local_188 = Vector2::operator*(&local_198,local_148);
      Vector2::operator+=(&local_b8,&local_188);
      NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator++
                ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
                 in_stack_fffffffffffffe10);
    }
    VVar4 = Vector2::operator/(&local_b8,4.0);
    in_stack_fffffffffffffe28 = local_a8.mesh;
    in_stack_fffffffffffffe30 = local_a8.ind;
    pVVar3 = MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::operator[]
                       ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> *)in_RDI
                        ,(Face)local_a8);
    pVVar3->x = VVar4.x;
    pVVar3->y = VVar4.y;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffe10)
    ;
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInFaceQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  facePrincipalCurvatureDirections = FaceData<Vector2>(mesh);

  for (Face f : mesh.faces()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : f.adjacentHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInFace[he];
      principalDir += -vec * vec / len * alpha;
    }

    facePrincipalCurvatureDirections[f] = principalDir / 4;
  }
}